

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<CallArgumentData,_16U>::SmallArray
          (SmallArray<CallArgumentData,_16U> *this,Allocator *allocator)

{
  CallArgumentData *local_20;
  Allocator *allocator_local;
  SmallArray<CallArgumentData,_16U> *this_local;
  
  local_20 = this->little;
  do {
    CallArgumentData::CallArgumentData(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (CallArgumentData *)&this->allocator);
  this->allocator = allocator;
  this->data = this->little;
  this->max = 0x10;
  this->count = 0;
  return;
}

Assistant:

SmallArray(Allocator *allocator = 0): allocator(allocator)
	{
		data = little;
		max = N;

		count = 0;
	}